

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O2

int testKNNValidatorSingleKdTreeIndex(void)

{
  bool bVar1;
  KNearestNeighborsClassifier *nnModel;
  NearestNeighborsIndex *this;
  SingleKdTreeIndex *pSVar2;
  ostream *poVar3;
  ostream *this_00;
  int iVar4;
  char *pcVar5;
  undefined1 auStack_a8 [40];
  Result res;
  Model m1;
  
  CoreML::Specification::Model::Model(&m1);
  CoreML::KNNValidatorTests::generateInterface(&m1);
  nnModel = CoreML::Specification::Model::_internal_mutable_knearestneighborsclassifier(&m1);
  CoreML::KNNValidatorTests::setNumberOfNeighbors(nnModel,3,true);
  CoreML::Specification::KNearestNeighborsClassifier::_internal_mutable_uniformweighting(nnModel);
  this = CoreML::Specification::KNearestNeighborsClassifier::_internal_mutable_nearestneighborsindex
                   (nnModel);
  pSVar2 = CoreML::Specification::NearestNeighborsIndex::_internal_mutable_singlekdtreeindex(this);
  CoreML::Specification::NearestNeighborsIndex::_internal_mutable_squaredeuclideandistance(this);
  CoreML::KNNValidatorTests::addDataPoints(nnModel);
  CoreML::KNNValidatorTests::addStringLabels(nnModel);
  CoreML::validate<(MLModelType)404>(&res,&m1);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    this_00 = (ostream *)std::operator<<(poVar3,":");
    iVar4 = 0x116;
LAB_0013b9d4:
    poVar3 = (ostream *)std::ostream::operator<<(this_00,iVar4);
    poVar3 = std::operator<<(poVar3,": error: ");
    pcVar5 = "!((res).good())";
  }
  else {
    pSVar2->leafsize_ = -1;
    CoreML::validate<(MLModelType)404>((Result *)auStack_a8,&m1);
    CoreML::Result::operator=(&res,(Result *)auStack_a8);
    std::__cxx11::string::~string((string *)(auStack_a8 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                              );
      this_00 = (ostream *)std::operator<<(poVar3,":");
      iVar4 = 0x11b;
      goto LAB_0013b9d4;
    }
    pSVar2->leafsize_ = 0x1e;
    CoreML::validate<(MLModelType)404>((Result *)auStack_a8,&m1);
    CoreML::Result::operator=(&res,(Result *)auStack_a8);
    std::__cxx11::string::~string((string *)(auStack_a8 + 8));
    bVar1 = CoreML::Result::good(&res);
    iVar4 = 0;
    if (bVar1) goto LAB_0013ba13;
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x120);
    poVar3 = std::operator<<(poVar3,": error: ");
    pcVar5 = "(res).good()";
  }
  poVar3 = std::operator<<(poVar3,pcVar5);
  poVar3 = std::operator<<(poVar3," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar4 = 1;
LAB_0013ba13:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m1);
  return iVar4;
}

Assistant:

int testKNNValidatorSingleKdTreeIndex() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    KNNValidatorTests::setNumberOfNeighbors(knnClassifier, 3, true);
    knnClassifier->mutable_uniformweighting();
    
    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    nnIndex->mutable_squaredeuclideandistance();

    KNNValidatorTests::addDataPoints(knnClassifier);
    KNNValidatorTests::addStringLabels(knnClassifier);

    // leaf size = 0 = bad.  We're requiring the user to specify a leaf size.
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    // leafSize < 0 = bad
    kdTree->set_leafsize(-1);
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    // leafSize > 0 = good
    kdTree->set_leafsize(30);
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);

    return 0;
}